

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

void __thiscall
duckdb_parquet::ColumnChunk::__set_crypto_metadata(ColumnChunk *this,ColumnCryptoMetaData *val)

{
  ColumnCryptoMetaData::operator=(&this->crypto_metadata,val);
  this->__isset = (_ColumnChunk__isset)((byte)this->__isset | 0x40);
  return;
}

Assistant:

void ColumnChunk::__set_crypto_metadata(const ColumnCryptoMetaData& val) {
  this->crypto_metadata = val;
__isset.crypto_metadata = true;
}